

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

CloudNode * Cloud_GetOneCube(CloudManager *dd,CloudNode *bFunc)

{
  CloudNode *pCVar1;
  CloudNode *pCVar2;
  ulong uVar3;
  
  uVar3 = (ulong)bFunc & 0xfffffffffffffffe;
  if ((*(uint *)(uVar3 + 4) & 0xefffffff) != 0xfffffff) {
    pCVar1 = bFunc->e;
    if (((ulong)bFunc & 1) == 0) {
      pCVar2 = bFunc->t;
    }
    else {
      pCVar1 = (CloudNode *)((ulong)pCVar1 ^ 1);
      pCVar2 = (CloudNode *)((ulong)bFunc->t ^ 1);
    }
    pCVar1 = Cloud_GetOneCube(dd,pCVar1);
    if (pCVar1 != (CloudNode *)0x0) {
      if (pCVar1 != dd->zero) {
        pCVar2 = (CloudNode *)((ulong)dd->vars[*(uint *)(uVar3 + 4)] ^ 1);
LAB_005d6cfa:
        pCVar1 = Cloud_bddAnd(dd,pCVar1,pCVar2);
        return pCVar1;
      }
      pCVar1 = Cloud_GetOneCube(dd,pCVar2);
      if (pCVar1 != (CloudNode *)0x0) {
        if (pCVar1 == dd->zero) {
          __assert_fail("res != dd->zero",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                        ,0x353,"CloudNode *Cloud_GetOneCube(CloudManager *, CloudNode *)");
        }
        pCVar2 = dd->vars[*(uint *)(uVar3 + 4)];
        goto LAB_005d6cfa;
      }
    }
    bFunc = (CloudNode *)0x0;
  }
  return bFunc;
}

Assistant:

CloudNode * Cloud_GetOneCube( CloudManager * dd, CloudNode * bFunc )
{
    CloudNode * bFunc0, * bFunc1, * res;

    if ( Cloud_IsConstant(bFunc) )
        return bFunc;

    // cofactor
    if ( Cloud_IsComplement(bFunc) )
    {
        bFunc0 = Cloud_Not( cloudE(bFunc) );
        bFunc1 = Cloud_Not( cloudT(bFunc) );
    }
    else
    {
        bFunc0 = cloudE(bFunc);
        bFunc1 = cloudT(bFunc);
    }

    // try to find the cube with the negative literal
    res = Cloud_GetOneCube( dd, bFunc0 );
    if ( res == NULL )
        return NULL;

    if ( res != dd->zero )
    {
        res = Cloud_bddAnd( dd, res, Cloud_Not(dd->vars[Cloud_V(bFunc)]) );
    }
    else
    {
        // try to find the cube with the positive literal
        res = Cloud_GetOneCube( dd, bFunc1 );
        if ( res == NULL )
            return NULL;
        assert( res != dd->zero );
        res = Cloud_bddAnd( dd, res, dd->vars[Cloud_V(bFunc)] );
    }
    return res;
}